

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O3

void create_descriptor(Init *init,Data *data)

{
  VkDescriptorPoolSize pool_size;
  VkDescriptorSetLayoutBinding binding;
  VkDescriptorPoolSize local_c0;
  VkDescriptorSetLayoutBinding local_b8;
  VkDescriptorSetLayoutCreateInfo local_98;
  VkDescriptorSetAllocateInfo local_78;
  VkDescriptorPoolCreateInfo local_48;
  
  local_48.pPoolSizes = &local_c0;
  local_c0.type = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_c0.descriptorCount = 2;
  local_48.pNext = (void *)0x0;
  local_48.flags = 0;
  local_48._28_4_ = 0;
  local_48.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  local_48._4_4_ = 0;
  local_48.maxSets = 1;
  local_48.poolSizeCount = 1;
  (*(init->disp).fp_vkCreateDescriptorPool)
            ((init->disp).device,&local_48,(VkAllocationCallbacks *)0x0,&data->descriptor_pool);
  local_98.pBindings = &local_b8;
  local_b8.pImmutableSamplers = (VkSampler *)0x0;
  local_b8.binding = 0;
  local_b8.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_b8.descriptorCount = 2;
  local_b8.stageFlags = 0x7fffffff;
  local_98.pNext = (void *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.flags = 0;
  local_98.bindingCount = 1;
  (*(init->disp).fp_vkCreateDescriptorSetLayout)
            ((init->disp).device,&local_98,(VkAllocationCallbacks *)0x0,&data->descriptor_set_layout
            );
  local_78.pNext = (void *)0x0;
  local_78.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  local_78._4_4_ = 0;
  local_78.descriptorPool = data->descriptor_pool;
  local_78.descriptorSetCount = 1;
  local_78._28_4_ = 0;
  local_78.pSetLayouts = &data->descriptor_set_layout;
  (*(init->disp).fp_vkAllocateDescriptorSets)((init->disp).device,&local_78,&data->descriptor_set);
  return;
}

Assistant:

void create_descriptor(Init& init, Data& data) {
    VkDescriptorPoolSize pool_size = { VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2 };

    VkDescriptorPoolCreateInfo pool_info = {};
    pool_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
    pool_info.flags = 0;
    pool_info.maxSets = 1;
    pool_info.poolSizeCount = 1;
    pool_info.pPoolSizes = &pool_size;
    init.disp.createDescriptorPool(&pool_info, nullptr, &data.descriptor_pool);

    VkDescriptorSetLayoutBinding binding = { 0, VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2, VK_SHADER_STAGE_ALL, nullptr };
    VkDescriptorSetLayoutCreateInfo dsl_info = {};
    dsl_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    dsl_info.flags = 0;
    dsl_info.bindingCount = 1;
    dsl_info.pBindings = &binding;
    init.disp.createDescriptorSetLayout(&dsl_info, nullptr, &data.descriptor_set_layout);

    VkDescriptorSetAllocateInfo ds_allocate_info = {};
    ds_allocate_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    ds_allocate_info.descriptorPool = data.descriptor_pool;
    ds_allocate_info.descriptorSetCount = 1;
    ds_allocate_info.pSetLayouts = &data.descriptor_set_layout;
    init.disp.allocateDescriptorSets(&ds_allocate_info, &data.descriptor_set);
}